

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void AnalyzeFunctionArgumentsFinal
               (ExpressionContext *ctx,SynBase *source,ExprBase *value,
               ArrayView<FunctionValue> functions,SynCallArgument *argumentHead,
               SmallArray<ArgumentData,_16U> *resultArguments)

{
  FunctionData *pFVar1;
  SynIdentifier *pSVar2;
  ArgumentData *pAVar3;
  IntrusiveList<MatchData> aliases_00;
  int iVar4;
  _func_int **pp_Var5;
  undefined4 extraout_var;
  ExprBase *pEVar6;
  SynShortFunctionArgument *pSVar7;
  ExprSequence *this;
  undefined4 extraout_var_01;
  ShortFunctionHandle *node_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TypeFunctionSet *pTVar8;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TypeBase *pTVar9;
  char *pcVar10;
  ulong uVar11;
  SynShortFunctionDefinition *syntax;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  uint uVar16;
  long lVar17;
  _func_int *p_Var18;
  ExprBase *pEVar19;
  ArrayView<TypeBase_*> setTypes;
  ArrayView<ArgumentData> currArguments;
  ArrayView<ArgumentData> currArguments_00;
  ArrayView<ExprBase_*> arr;
  IntrusiveList<ShortFunctionHandle> overloads;
  SmallArray<ExprBase_*,_16U> options;
  IntrusiveList<MatchData> aliases;
  SmallArray<ExprBase_*,_3U> local_1d0;
  FunctionValue *local_1a0;
  ExprBase *local_198;
  ulong local_190;
  IntrusiveList<ShortFunctionHandle> local_188;
  SmallArray<ExprBase_*,_16U> local_170;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [144];
  Allocator *local_38;
  MatchData *node;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  local_1a0 = functions.data;
  if (argumentHead != (SynCallArgument *)0x0) {
    uVar16 = functions.count;
    local_190 = (ulong)uVar16;
    uVar13 = 0;
    local_198 = value;
    do {
      if ((uVar16 == 0) && (argumentHead->name != (SynIdentifier *)0x0)) {
        anon_unknown.dwarf_c6b42::Stop
                  (ctx,source,"ERROR: function argument names are unknown at this point");
      }
      syntax = (SynShortFunctionDefinition *)argumentHead->value;
      if ((syntax == (SynShortFunctionDefinition *)0x0) || ((syntax->super_SynBase).typeID != 0x39))
      {
        syntax = (SynShortFunctionDefinition *)0x0;
      }
      uVar12 = (uint)uVar13;
      if (syntax != (SynShortFunctionDefinition *)0x0) {
        local_170.allocator = ctx->allocator;
        local_170.data = local_170.little;
        local_170.count = 0;
        local_170.max = 0x10;
        if (uVar16 == 0) {
          if (resultArguments->count < uVar12) {
LAB_00178c5b:
            __assert_fail("size <= rhs.size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x20a,
                          "ArrayView<ArgumentData>::ArrayView(SmallArray<T, N> &, unsigned int) [T = ArgumentData, N = 16U]"
                         );
          }
          local_d8 = 0;
          uStack_d0 = 0;
          currArguments_00._8_8_ = uVar13;
          currArguments_00.data = resultArguments->data;
          pEVar6 = AnalyzeShortFunctionDefinition
                             (ctx,syntax,local_198->type,currArguments_00,
                              (IntrusiveList<MatchData>)ZEXT816(0));
          if (pEVar6 != (ExprBase *)0x0) {
            if (local_170.count == local_170.max) {
              SmallArray<ExprBase_*,_16U>::grow(&local_170,local_170.count);
            }
            if (local_170.data == (ExprBase **)0x0) {
LAB_00178c99:
              pcVar10 = 
              "void SmallArray<ExprBase *, 16>::push_back(const T &) [T = ExprBase *, N = 16]";
LAB_00178cfb:
              __assert_fail("data",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x162,pcVar10);
            }
            uVar14 = local_170._8_8_ & 0xffffffff;
            local_170.count = local_170.count + 1;
            local_170.data[uVar14] = pEVar6;
          }
        }
        else {
          uVar14 = 0;
          do {
            local_c8._0_8_ = (MatchData *)0x0;
            local_c8._8_4_ = 0;
            local_c8._12_4_ = 0;
            pFVar1 = local_1a0[uVar14].function;
            if (pFVar1->scope->ownerType != (TypeBase *)0x0) {
              pTVar9 = (local_1a0[uVar14].context)->type;
              if ((pTVar9 == (TypeBase *)0x0) || (pTVar9->typeID != 0x12)) {
                pTVar9 = (TypeBase *)0x0;
              }
              if (pTVar9 != (TypeBase *)0x0) {
                pp_Var5 = pTVar9[1]._vptr_TypeBase;
                if ((pp_Var5 == (_func_int **)0x0) || (*(int *)(pp_Var5 + 1) != 0x18)) {
                  pp_Var5 = (_func_int **)0x0;
                }
                if (pp_Var5 != (_func_int **)0x0) {
                  for (p_Var18 = pp_Var5[0x1e]; p_Var18 != (_func_int *)0x0;
                      p_Var18 = *(_func_int **)(p_Var18 + 0x10)) {
                    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
                    node = (MatchData *)CONCAT44(extraout_var,iVar4);
                    pSVar2 = *(SynIdentifier **)p_Var18;
                    pTVar9 = *(TypeBase **)(p_Var18 + 8);
                    node->name = pSVar2;
                    node->type = pTVar9;
                    node->next = (MatchData *)0x0;
                    node->listed = false;
                    if (pSVar2 == (SynIdentifier *)0x0) {
                      __assert_fail("name",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                                    ,0xf6,"MatchData::MatchData(SynIdentifier *, TypeBase *)");
                    }
                    IntrusiveList<MatchData>::push_back((IntrusiveList<MatchData> *)local_c8,node);
                  }
                }
              }
            }
            if (resultArguments->count < uVar12) goto LAB_00178c5b;
            aliases_00.tail._4_4_ = local_c8._12_4_;
            aliases_00.tail._0_4_ = local_c8._8_4_;
            aliases_00.head = (MatchData *)local_c8._0_8_;
            currArguments._8_8_ = uVar13;
            currArguments.data = resultArguments->data;
            pEVar6 = AnalyzeShortFunctionDefinition
                               (ctx,syntax,&pFVar1->type->super_TypeBase,currArguments,aliases_00);
            if (pEVar6 != (ExprBase *)0x0) {
              if ((local_170._8_8_ & 0xffffffff) != 0) {
                uVar11 = 0;
                bVar15 = false;
                do {
                  if (local_170.data[uVar11]->type == pEVar6->type) {
                    bVar15 = true;
                  }
                  uVar11 = uVar11 + 1;
                } while ((local_170._8_8_ & 0xffffffff) != uVar11);
                if (bVar15) goto LAB_001786c3;
              }
              if (local_170.count == local_170.max) {
                SmallArray<ExprBase_*,_16U>::grow(&local_170,local_170.count);
              }
              if (local_170.data == (ExprBase **)0x0) goto LAB_00178c99;
              uVar11 = local_170._8_8_ & 0xffffffff;
              local_170.count = local_170.count + 1;
              local_170.data[uVar11] = pEVar6;
            }
LAB_001786c3:
            uVar14 = uVar14 + 1;
          } while (uVar14 != local_190);
        }
        if (local_170.count == 1) {
          pEVar6 = *local_170.data;
        }
        else if (local_170.count == 0) {
          pSVar7 = (syntax->arguments).head;
          if (pSVar7 == (SynShortFunctionArgument *)0x0) {
            uVar14 = 0;
          }
          else {
            uVar14 = 0;
            do {
              uVar14 = (ulong)((int)uVar14 + 1);
              pSVar7 = (SynShortFunctionArgument *)(pSVar7->super_SynBase).next;
            } while (pSVar7 != (SynShortFunctionArgument *)0x0);
          }
          anon_unknown.dwarf_c6b42::Report
                    (ctx,source,
                     "ERROR: cannot find function which accepts a function with %d argument(s) as an argument #%d"
                     ,uVar14,(ulong)(uVar12 + 1));
          iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
          pEVar6 = (ExprBase *)CONCAT44(extraout_var_06,iVar4);
          pTVar9 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
          pEVar6->typeID = 0;
          pEVar6->source = source;
          pEVar6->type = pTVar9;
          pEVar6->next = (ExprBase *)0x0;
          pEVar6->listed = false;
          pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprError_00248b28;
          pEVar6[2]._vptr_ExprBase = (_func_int **)0x0;
          pEVar6[1]._vptr_ExprBase = (_func_int **)&pEVar6[1].source;
          *(undefined8 *)&pEVar6[1].typeID = 0x400000000;
        }
        else {
          local_38 = ctx->allocator;
          local_c8._0_8_ = local_c8 + 0x10;
          local_c8._8_4_ = 0;
          local_c8._12_4_ = 0x10;
          local_188.head = (ShortFunctionHandle *)0x0;
          local_188.tail = (ShortFunctionHandle *)0x0;
          if (local_170.count != 0) {
            lVar17 = 0;
            do {
              pEVar6 = local_170.data[lVar17];
              if ((pEVar6 == (ExprBase *)0x0) ||
                 ((pEVar6->typeID != 0x24 &&
                  ((pEVar6 == (ExprBase *)0x0 || (pEVar6->typeID != 0x25)))))) {
                __assert_fail("isType<ExprFunctionDefinition>(option) || isType<ExprGenericFunctionPrototype>(option)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                              ,0x1cbb,
                              "void AnalyzeFunctionArgumentsFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, SynCallArgument *, SmallArray<ArgumentData, 16> &)"
                             );
              }
              if (local_c8._8_4_ == local_c8._12_4_) {
                SmallArray<TypeBase_*,_16U>::grow
                          ((SmallArray<TypeBase_*,_16U> *)local_c8,local_c8._8_4_);
              }
              if ((MatchData *)local_c8._0_8_ == (MatchData *)0x0) {
                pcVar10 = 
                "void SmallArray<TypeBase *, 16>::push_back(const T &) [T = TypeBase *, N = 16]";
                goto LAB_00178cfb;
              }
              uVar14 = (ulong)(uint)local_c8._8_4_;
              local_c8._8_4_ = local_c8._8_4_ + 1;
              ((SynIdentifier **)local_c8._0_8_)[uVar14] = (SynIdentifier *)pEVar6->type;
              if (local_170.count <= (uint)lVar17) {
                pcVar10 = 
                "T &SmallArray<ExprBase *, 16>::operator[](unsigned int) [T = ExprBase *, N = 16]";
                goto LAB_00178cc5;
              }
              pEVar19 = local_170.data[lVar17];
              if ((pEVar19 == (ExprBase *)0x0) || (pEVar19->typeID != 0x24)) {
                pEVar19 = (ExprBase *)0x0;
              }
              if (pEVar19 == (ExprBase *)0x0) {
                if ((pEVar6 == (ExprBase *)0x0) || (pEVar6->typeID != 0x25)) {
                  pEVar6 = (ExprBase *)0x0;
                }
                if (pEVar6 != (ExprBase *)0x0) {
                  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
                  this = (ExprSequence *)CONCAT44(extraout_var_01,iVar4);
                  pTVar9 = (TypeBase *)pEVar6[1]._vptr_ExprBase[6];
                  (this->super_ExprBase).typeID = 9;
                  (this->super_ExprBase).source = source;
                  (this->super_ExprBase).type = pTVar9;
                  (this->super_ExprBase).next = (ExprBase *)0x0;
                  (this->super_ExprBase).listed = false;
                  (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002485e0;
                  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
                  node_00 = (ShortFunctionHandle *)CONCAT44(extraout_var_02,iVar4);
                  goto LAB_00178a77;
                }
              }
              else {
                if (*(long *)&pEVar19[2].typeID == 0) {
                  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
                  this = (ExprSequence *)CONCAT44(extraout_var_03,iVar4);
                  pTVar9 = (TypeBase *)pEVar19[1]._vptr_ExprBase[6];
                  (this->super_ExprBase).typeID = 9;
                  (this->super_ExprBase).source = source;
                  (this->super_ExprBase).type = pTVar9;
                  (this->super_ExprBase).next = (ExprBase *)0x0;
                  (this->super_ExprBase).listed = false;
                  (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002485e0;
                }
                else {
                  local_1d0.allocator = ctx->allocator;
                  local_1d0.data = local_1d0.little;
                  local_1d0.count = 1;
                  local_1d0.little[0] = pEVar19;
                  if (*(ExprBase **)&pEVar19[2].typeID != (ExprBase *)0x0) {
                    local_1d0.max = 3;
                    local_1d0.count = 1;
                    if (local_1d0.data != (ExprBase **)0x0) {
                      local_1d0.count = 2;
                      local_1d0.little[1] = *(ExprBase **)&pEVar19[2].typeID;
                      goto LAB_00178909;
                    }
LAB_00178ce6:
                    pcVar10 = 
                    "void SmallArray<ExprBase *, 3>::push_back(const T &) [T = ExprBase *, N = 3]";
                    goto LAB_00178cfb;
                  }
LAB_00178909:
                  local_1d0.max = 3;
                  if ((VariableData *)pEVar19[2].source != (VariableData *)0x0) {
                    pEVar6 = CreateVariableAccess(ctx,source,(VariableData *)pEVar19[2].source,true)
                    ;
                    if (local_1d0.count == local_1d0.max) {
                      SmallArray<ExprBase_*,_3U>::grow(&local_1d0,local_1d0.count);
                    }
                    if (local_1d0.data == (ExprBase **)0x0) goto LAB_00178ce6;
                    uVar14 = (ulong)local_1d0.count;
                    local_1d0.count = local_1d0.count + 1;
                    local_1d0.data[uVar14] = pEVar6;
                  }
                  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
                  this = (ExprSequence *)CONCAT44(extraout_var_00,iVar4);
                  arr.count = local_1d0.count;
                  arr.data = local_1d0.data;
                  arr._12_4_ = 0;
                  ExprSequence::ExprSequence
                            (this,ctx->allocator,source,(TypeBase *)pEVar19[1]._vptr_ExprBase[6],arr
                            );
                  SmallArray<ExprBase_*,_3U>::~SmallArray(&local_1d0);
                }
                iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
                node_00 = (ShortFunctionHandle *)CONCAT44(extraout_var_04,iVar4);
                pEVar6 = pEVar19;
LAB_00178a77:
                node_00->function = (FunctionData *)pEVar6[1]._vptr_ExprBase;
                node_00->context = &this->super_ExprBase;
                node_00->next = (ShortFunctionHandle *)0x0;
                node_00->listed = false;
                IntrusiveList<ShortFunctionHandle>::push_back(&local_188,node_00);
              }
              lVar17 = lVar17 + 1;
            } while ((uint)lVar17 < local_170.count);
          }
          setTypes.count = local_c8._8_4_;
          setTypes.data = (TypeBase **)local_c8._0_8_;
          setTypes._12_4_ = 0;
          pTVar8 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
          iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          pEVar6 = (ExprBase *)CONCAT44(extraout_var_05,iVar4);
          pEVar6->typeID = 0x28;
          pEVar6->source = source;
          pEVar6->type = &pTVar8->super_TypeBase;
          pEVar6->next = (ExprBase *)0x0;
          pEVar6->listed = false;
          pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248f50;
          pEVar6[1]._vptr_ExprBase = (_func_int **)local_188.head;
          *(ShortFunctionHandle **)&pEVar6[1].typeID = local_188.tail;
          SmallArray<TypeBase_*,_16U>::~SmallArray((SmallArray<TypeBase_*,_16U> *)local_c8);
        }
        if (resultArguments->count <= uVar12) {
          pcVar10 = 
          "T &SmallArray<ArgumentData, 16>::operator[](unsigned int) [T = ArgumentData, N = 16]";
LAB_00178cc5:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,pcVar10);
        }
        pTVar9 = pEVar6->type;
        pSVar2 = argumentHead->name;
        pAVar3 = resultArguments->data;
        pAVar3[uVar13].source = &argumentHead->super_SynBase;
        pAVar3[uVar13].isExplicit = false;
        pAVar3[uVar13].name = pSVar2;
        pAVar3[uVar13].type = pTVar9;
        pAVar3[uVar13].value = pEVar6;
        pAVar3[uVar13].valueFunction = (FunctionData *)0x0;
        SmallArray<ExprBase_*,_16U>::~SmallArray(&local_170);
      }
      argumentHead = (SynCallArgument *)(argumentHead->super_SynBase).next;
      if ((argumentHead == (SynCallArgument *)0x0) || ((argumentHead->super_SynBase).typeID != 0x18)
         ) {
        argumentHead = (SynCallArgument *)0x0;
      }
      uVar13 = (ulong)(uVar12 + 1);
    } while (argumentHead != (SynCallArgument *)0x0);
  }
  return;
}

Assistant:

void AnalyzeFunctionArgumentsFinal(ExpressionContext &ctx, SynBase *source, ExprBase *value, ArrayView<FunctionValue> functions, SynCallArgument *argumentHead, SmallArray<ArgumentData, 16> &resultArguments)
{
	unsigned pos = 0;

	for(SynCallArgument *el = argumentHead; el; el = getType<SynCallArgument>(el->next))
	{
		if(functions.empty() && el->name)
			Stop(ctx, source, "ERROR: function argument names are unknown at this point");

		if(SynShortFunctionDefinition *node = getType<SynShortFunctionDefinition>(el->value))
		{
			SmallArray<ExprBase*, 16> options(ctx.allocator);

			if(functions.empty())
			{
				if(ExprBase *option = AnalyzeShortFunctionDefinition(ctx, node, value->type, ArrayView<ArgumentData>(resultArguments, pos), IntrusiveList<MatchData>()))
					options.push_back(option);
			}
			else
			{
				for(unsigned i = 0; i < functions.size(); i++)
				{
					IntrusiveList<MatchData> aliases;

					FunctionData *function = functions[i].function;

					if(function->scope->ownerType)
					{
						if(TypeRef *contextType = getType<TypeRef>(functions[i].context->type))
						{
							if(TypeClass *classType = getType<TypeClass>(contextType->subType))
							{
								for(MatchData *el = classType->generics.head; el; el = el->next)
									aliases.push_back(new (ctx.get<MatchData>()) MatchData(el->name, el->type));
							}
						}
					}

					if(ExprBase *option = AnalyzeShortFunctionDefinition(ctx, node, function->type, ArrayView<ArgumentData>(resultArguments, pos), aliases))
					{
						bool found = false;

						for(unsigned k = 0; k < options.size(); k++)
						{
							if(options[k]->type == option->type)
								found = true;
						}

						if(!found)
							options.push_back(option);
					}
				}
			}

			ExprBase *argument = NULL;

			if(options.empty())
			{
				Report(ctx, source, "ERROR: cannot find function which accepts a function with %d argument(s) as an argument #%d", node->arguments.size(), pos + 1);

				argument = new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
			}
			else if(options.size() == 1)
			{
				argument = options[0];
			}
			else
			{
				SmallArray<TypeBase*, 16> types(ctx.allocator);

				IntrusiveList<ShortFunctionHandle> overloads;

				for(unsigned i = 0; i < options.size(); i++)
				{
					ExprBase *option = options[i];

					assert(isType<ExprFunctionDefinition>(option) || isType<ExprGenericFunctionPrototype>(option));

					types.push_back(option->type);

					if(ExprFunctionDefinition *node = getType<ExprFunctionDefinition>(options[i]))
					{
						ExprBase *context = NULL;

						if(node->contextVariableDefinition)
						{
							SmallArray<ExprBase*, 3> expressions(ctx.allocator);

							expressions.push_back(node);

							if(node->contextVariableDefinition)
								expressions.push_back(node->contextVariableDefinition);

							if(node->contextVariable)
								expressions.push_back(CreateVariableAccess(ctx, source, node->contextVariable, true));

							context = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, source, node->function->contextType, expressions);
						}
						else
						{
							context = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, node->function->contextType);
						}

						overloads.push_back(new (ctx.get<ShortFunctionHandle>()) ShortFunctionHandle(node->function, context));
					}
					else if(ExprGenericFunctionPrototype *node = getType<ExprGenericFunctionPrototype>(option))
					{
						ExprBase *context = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, node->function->contextType);

						overloads.push_back(new (ctx.get<ShortFunctionHandle>()) ShortFunctionHandle(node->function, context));
					}
				}

				TypeFunctionSet *type = ctx.GetFunctionSetType(types);

				argument = new (ctx.get<ExprShortFunctionOverloadSet>()) ExprShortFunctionOverloadSet(source, type, overloads);
			}

			resultArguments[pos++] = ArgumentData(el, false, el->name, argument->type, argument);
		}
		else
		{
			pos++;
		}
	}
}